

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::XThreadEvent::traceEvent(XThreadEvent *this)

{
  TraceBuilder *in_RSI;
  
  traceEvent((XThreadEvent *)&this[-1].replyLink.prev,in_RSI);
  return;
}

Assistant:

void XThreadEvent::traceEvent(TraceBuilder& builder) {
  KJ_IF_SOME(n, promiseNode) {
    n->tracePromise(builder, true);
  }

  // We can't safely trace into another thread, so we'll stop here.
  builder.add(funcTracePtr);
}